

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::SingleContextRenderCase::executeForSurface
          (SingleContextRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config)

{
  Library *pLVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  Library *egl;
  undefined4 extraout_var;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> contextAttribs;
  UniqueContext context;
  
  egl = EglTestContext::getLibrary
                  ((this->super_RenderCase).super_SimpleConfigCase.super_TestCase.m_eglTestCtx);
  pLVar1 = (Library *)
           ((this->super_RenderCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  uVar2 = eglu::getConfigAttribInt(egl,display,config->config,0x3040);
  checkBuildClientAPISupport(*(EGLint *)&(this->super_RenderCase).field_0xbc);
  lVar7 = 0;
  do {
    if (lVar7 == 0x10) {
      (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
      dVar3 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                       ,0x11f);
      return;
    }
    uVar5 = *(uint *)((long)&DAT_017fb6b0 + lVar7);
    if (((uVar2 & uVar5) != 0) && ((*(uint *)&(this->super_RenderCase).field_0xbc & uVar5) != 0)) {
      contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (uVar5 == 1) {
        context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,0x3098);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
        context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,1);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
        uVar5 = 0x30a0;
        pcVar6 = "OpenGL ES 1.x";
      }
      else if (uVar5 == 2) {
        uVar5 = 0x30a1;
        pcVar6 = "OpenVG";
      }
      else if (uVar5 == 0x40) {
        context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,0x3098);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
        context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,3);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
        uVar5 = 0x30a0;
        pcVar6 = "OpenGL ES 3.x";
      }
      else if (uVar5 == 4) {
        context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,0x3098);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
        context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
        uVar5 = 0x30a0;
        pcVar6 = "OpenGL ES 2.x";
      }
      else {
        uVar5 = 0x3038;
        pcVar6 = (char *)0x0;
      }
      context.m_egl = (Library *)CONCAT44(context.m_egl._4_4_,0x3038);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&contextAttribs,(int *)&context);
      context.m_egl = pLVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&context.m_display);
      std::operator<<((ostream *)&context.m_display,pcVar6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&context,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&context.m_display);
      (**egl->_vptr_Library)(egl,(ulong)uVar5);
      dVar3 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar3,"bindAPI(api)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                       ,0x114);
      iVar4 = (*egl->_vptr_Library[6])
                        (egl,display,config->config,0,
                         contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      eglu::UniqueContext::UniqueContext
                (&context,egl,display,(EGLContext)CONCAT44(extraout_var,iVar4));
      (*egl->_vptr_Library[0x27])(egl,display,surface,surface,context.m_context);
      dVar3 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar3,"makeCurrent(display, surface, surface, *context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                       ,0x118);
      (*(this->super_RenderCase).super_SimpleConfigCase.super_TestCase.super_TestCase.super_TestNode
        ._vptr_TestNode[7])(this,display,context.m_context,surface);
      iVar4 = config->surfaceTypeBit;
      if (iVar4 == 1) {
        (*egl->_vptr_Library[0x36])(egl);
        dVar3 = (*egl->_vptr_Library[0x1f])(egl);
        pcVar6 = "waitClient()";
        iVar4 = 0x43;
LAB_00e0c901:
        eglu::checkError(dVar3,pcVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                         ,iVar4);
      }
      else {
        if (iVar4 == 2) {
          (*egl->_vptr_Library[0x36])(egl);
          dVar3 = (*egl->_vptr_Library[0x1f])(egl);
          pcVar6 = "waitClient()";
          iVar4 = 0x41;
          goto LAB_00e0c901;
        }
        if (iVar4 == 4) {
          (*egl->_vptr_Library[0x31])(egl,display,surface);
          dVar3 = (*egl->_vptr_Library[0x1f])(egl);
          pcVar6 = "swapBuffers(display, surface)";
          iVar4 = 0x3f;
          goto LAB_00e0c901;
        }
      }
      eglu::UniqueContext::~UniqueContext(&context);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&contextAttribs.super__Vector_base<int,_std::allocator<int>_>);
    }
    lVar7 = lVar7 + 4;
  } while( true );
}

Assistant:

void SingleContextRenderCase::executeForSurface (EGLDisplay display, EGLSurface surface, const Config& config)
{
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const EGLint		apis[]			= { EGL_OPENGL_ES2_BIT, EGL_OPENGL_ES3_BIT_KHR, EGL_OPENGL_ES_BIT, EGL_OPENVG_BIT };
	tcu::TestLog&		log				= m_testCtx.getLog();
	const EGLint		configApiMask	= eglu::getConfigAttribInt(egl, display, config.config, EGL_RENDERABLE_TYPE);

	checkBuildClientAPISupport(m_apiMask);

	for (int apiNdx = 0; apiNdx < DE_LENGTH_OF_ARRAY(apis); apiNdx++)
	{
		EGLint apiBit = apis[apiNdx];

		// Skip API if build or current config doesn't support it.
		if ((apiBit & m_apiMask) == 0 || (apiBit & configApiMask) == 0)
			continue;

		EGLint			api		= EGL_NONE;
		const char*		apiName	= DE_NULL;
		vector<EGLint>	contextAttribs;

		// Select api enum and build context attributes.
		switch (apiBit)
		{
			case EGL_OPENGL_ES2_BIT:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 2.x";
				contextAttribs.push_back(EGL_CONTEXT_CLIENT_VERSION);
				contextAttribs.push_back(2);
				break;

			case EGL_OPENGL_ES3_BIT_KHR:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 3.x";
				contextAttribs.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
				contextAttribs.push_back(3);
				break;

			case EGL_OPENGL_ES_BIT:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 1.x";
				contextAttribs.push_back(EGL_CONTEXT_CLIENT_VERSION);
				contextAttribs.push_back(1);
				break;

			case EGL_OPENVG_BIT:
				api		= EGL_OPENVG_API;
				apiName	= "OpenVG";
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		contextAttribs.push_back(EGL_NONE);

		log << TestLog::Message << apiName << TestLog::EndMessage;

		EGLU_CHECK_CALL(egl, bindAPI(api));

		eglu::UniqueContext	context	(egl, display, egl.createContext(display, config.config, EGL_NO_CONTEXT, &contextAttribs[0]));

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, *context));
		executeForContext(display, *context, surface, Config(config.config, config.surfaceTypeBit, apiBit));

		// Call SwapBuffers() / WaitClient() to finish rendering
		postSurface(egl, display, surface, config.surfaceTypeBit);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}